

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  altsvcinfo *data_00;
  char *pcVar4;
  CURLcode CVar5;
  int iVar6;
  alpnid dstalpnid_00;
  char *pcVar7;
  size_t sVar8;
  altsvc *p_00;
  time_t tVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  ulong local_2f0;
  unsigned_long port;
  char *hostp;
  _Bool valid;
  char *pcStack_2d8;
  _Bool persist;
  time_t maxage;
  char *pcStack_2c8;
  _Bool quoted;
  char *end_ptr;
  unsigned_long num;
  char option [32];
  char *value_ptr;
  char *dsthost;
  long lStack_280;
  alpnid dstalpnid;
  size_t entries;
  CURLcode result;
  unsigned_short dstport;
  altsvc *as;
  char alpnbuf [10];
  char namebuf [512];
  ulong local_50;
  size_t len;
  char *p;
  char *pcStack_38;
  unsigned_short srcport_local;
  char *srchost_local;
  char *pcStack_28;
  alpnid srcalpnid_local;
  char *value_local;
  altsvcinfo *asi_local;
  Curl_easy *data_local;
  
  len = (size_t)value;
  p._6_2_ = srcport;
  pcStack_38 = srchost;
  srchost_local._4_4_ = srcalpnid;
  pcStack_28 = value;
  value_local = (char *)asi;
  asi_local = (altsvcinfo *)data;
  memset(alpnbuf + 2,0,0x200);
  memset((void *)((long)&as + 6),0,10);
  entries._6_2_ = p._6_2_;
  CVar5 = getalnum((char **)&len,(char *)((long)&as + 6),10);
  lStack_280 = 0;
  if (CVar5 == CURLE_OK) {
    iVar6 = curl_strequal((char *)((long)&as + 6),"clear");
    if (iVar6 == 0) {
      do {
        if (*(char *)len != '=') {
          return CURLE_OK;
        }
        dstalpnid_00 = alpn2alpnid((char *)((long)&as + 6));
        if (*(char *)(len + 1) != '\"') {
          return CURLE_OK;
        }
        value_ptr = "";
        bVar12 = false;
        pcStack_2d8 = (char *)0x15180;
        hostp._7_1_ = false;
        bVar2 = true;
        pcVar7 = (char *)(len + 2);
        if (*pcVar7 == ':') {
          value_ptr = pcStack_38;
          len = (size_t)pcVar7;
        }
        else {
          pcVar4 = pcVar7;
          if (*pcVar7 == '[') {
            len = len + 3;
            sVar8 = strspn((char *)len,"0123456789abcdefABCDEF:.");
            if (*(char *)(len + sVar8) != ']') {
              return CURLE_OK;
            }
            local_50 = sVar8 + 2;
            len = len + sVar8 + 1;
          }
          else {
            while( true ) {
              len = (size_t)pcVar4;
              bVar11 = false;
              if ((((*(char *)len != '\0') &&
                   ((*(char *)len < '0' || (bVar11 = true, '9' < *(char *)len)))) &&
                  ((*(char *)len < 'a' || (bVar11 = true, 'z' < *(char *)len)))) &&
                 (((*(char *)len < 'A' || (bVar11 = true, 'Z' < *(char *)len)) &&
                  (bVar11 = true, *(char *)len != '.')))) {
                bVar11 = *(char *)len == '-';
              }
              if (!bVar11) break;
              pcVar4 = (char *)(len + 1);
            }
            local_50 = len - (long)pcVar7;
          }
          if ((local_50 == 0) || (0x1ff < local_50)) {
            if (((asi_local != (altsvcinfo *)0x0) &&
                ((*(ulong *)((long)&asi_local[0x38].list._dtor + 2) >> 0x1c & 1) != 0)) &&
               ((asi_local[0x66].filename == (char *)0x0 ||
                (0 < *(int *)(asi_local[0x66].filename + 8))))) {
              Curl_infof((Curl_easy *)asi_local,"Excessive alt-svc hostname, ignoring.");
            }
            bVar2 = false;
          }
          else {
            memcpy(alpnbuf + 2,pcVar7,local_50);
            alpnbuf[local_50 + 2] = '\0';
            value_ptr = alpnbuf + 2;
          }
        }
        if (*(char *)len == ':') {
          local_2f0 = 0;
          len = len + 1;
          pcVar7 = (char *)len;
          if (('/' < *(char *)len) && (*(char *)len < ':')) {
            local_2f0 = strtoul((char *)len,&stack0xfffffffffffffd38,10);
            pcVar7 = pcStack_2c8;
          }
          pcStack_2c8 = pcVar7;
          if ((((local_2f0 == 0) || (0xffff < local_2f0)) || (pcStack_2c8 == (char *)len)) ||
             (*pcStack_2c8 != '\"')) {
            if (((asi_local != (altsvcinfo *)0x0) &&
                ((*(ulong *)((long)&asi_local[0x38].list._dtor + 2) >> 0x1c & 1) != 0)) &&
               ((asi_local[0x66].filename == (char *)0x0 ||
                (0 < *(int *)(asi_local[0x66].filename + 8))))) {
              Curl_infof((Curl_easy *)asi_local,"Unknown alt-svc port number, ignoring.");
            }
            bVar2 = false;
          }
          else {
            entries._6_2_ = curlx_ultous(local_2f0);
            len = (size_t)pcStack_2c8;
          }
        }
        cVar1 = *(char *)len;
        len = len + 1;
        if (cVar1 != '\"') {
          return CURLE_OK;
        }
        while( true ) {
          while( true ) {
            bVar11 = true;
            if (*(char *)len != ' ') {
              bVar11 = *(char *)len == '\t';
            }
            if (!bVar11) break;
            len = len + 1;
          }
          if (((*(char *)len != ';') || (len = len + 1, *(char *)len == '\0')) ||
             ((*(char *)len == '\n' || (*(char *)len == '\r')))) break;
          CVar5 = getalnum((char **)&len,(char *)&num,0x20);
          if (CVar5 != CURLE_OK) {
            num._0_1_ = 0;
          }
          while( true ) {
            bVar11 = false;
            if ((*(char *)len != '\0') && (bVar11 = true, *(char *)len != ' ')) {
              bVar11 = *(char *)len == '\t';
            }
            if (!bVar11) break;
            len = len + 1;
          }
          if (*(char *)len != '=') {
            return CURLE_OK;
          }
          do {
            sVar3 = len;
            len = sVar3 + 1;
            bVar11 = false;
            if ((*(char *)len != '\0') && (bVar11 = true, *(char *)len != ' ')) {
              bVar11 = *(char *)len == '\t';
            }
          } while (bVar11);
          if (*(char *)len == '\0') {
            return CURLE_OK;
          }
          if (*(char *)len == '\"') {
            len = sVar3 + 2;
            bVar12 = true;
          }
          sVar3 = len;
          option[0x18] = (undefined1)len;
          option[0x19] = len._1_1_;
          option[0x1a] = len._2_1_;
          option[0x1b] = len._3_1_;
          option[0x1c] = len._4_1_;
          option[0x1d] = len._5_1_;
          option[0x1e] = len._6_1_;
          option[0x1f] = len._7_1_;
          if (bVar12) {
            while( true ) {
              bVar11 = false;
              if (*(char *)len != '\0') {
                bVar11 = *(char *)len != '\"';
              }
              if (!bVar11) break;
              len = len + 1;
            }
            cVar1 = *(char *)len;
            len = len + 1;
            if (cVar1 == '\0') {
              return CURLE_OK;
            }
          }
          else {
            while( true ) {
              bVar11 = false;
              if ((((*(char *)len != '\0') && (bVar11 = false, *(char *)len != ' ')) &&
                  (bVar11 = false, *(char *)len != '\t')) && (bVar11 = false, *(char *)len != ';'))
              {
                bVar11 = *(char *)len != ',';
              }
              if (!bVar11) break;
              len = len + 1;
            }
          }
          end_ptr = (char *)strtoul((char *)sVar3,&stack0xfffffffffffffd38,10);
          if ((pcStack_2c8 != (char *)option._24_8_) && (end_ptr != (char *)0xffffffffffffffff)) {
            iVar6 = curl_strequal("ma",(char *)&num);
            if (iVar6 == 0) {
              iVar6 = curl_strequal("persist",(char *)&num);
              if ((iVar6 != 0) && (end_ptr == (char *)0x1)) {
                hostp._7_1_ = true;
              }
            }
            else {
              pcStack_2d8 = end_ptr;
            }
          }
        }
        if ((dstalpnid_00 != ALPN_none) && (bVar2)) {
          lVar10 = lStack_280 + 1;
          if (lStack_280 == 0) {
            altsvc_flush((altsvcinfo *)value_local,srchost_local._4_4_,pcStack_38,p._6_2_);
          }
          p_00 = altsvc_createid(pcStack_38,value_ptr,srchost_local._4_4_,dstalpnid_00,(uint)p._6_2_
                                 ,(uint)entries._6_2_);
          lStack_280 = lVar10;
          if (p_00 != (altsvc *)0x0) {
            tVar9 = time((time_t *)0x0);
            p_00->expires = (time_t)(pcStack_2d8 + tVar9);
            p_00->persist = hostp._7_1_;
            Curl_llist_append((Curl_llist *)(value_local + 8),p_00,&p_00->node);
            data_00 = asi_local;
            if (((asi_local != (altsvcinfo *)0x0) &&
                ((*(ulong *)((long)&asi_local[0x38].list._dtor + 2) >> 0x1c & 1) != 0)) &&
               ((asi_local[0x66].filename == (char *)0x0 ||
                (0 < *(int *)(asi_local[0x66].filename + 8))))) {
              pcVar7 = Curl_alpnid2str(dstalpnid_00);
              Curl_infof((Curl_easy *)data_00,"Added alt-svc: %s:%d over %s",value_ptr,
                         (ulong)entries._6_2_,pcVar7);
            }
          }
        }
        if (*(char *)len == ',') {
          len = len + 1;
          CVar5 = getalnum((char **)&len,(char *)((long)&as + 6),10);
          if (CVar5 != CURLE_OK) {
            return CURLE_OK;
          }
        }
        bVar12 = false;
        if (((*(char *)len != '\0') && (bVar12 = false, *(char *)len != ';')) &&
           (bVar12 = false, *(char *)len != '\n')) {
          bVar12 = *(char *)len != '\r';
        }
      } while (bVar12);
    }
    else {
      altsvc_flush((altsvcinfo *)value_local,srchost_local._4_4_,pcStack_38,p._6_2_);
    }
  }
  else if (((asi_local != (altsvcinfo *)0x0) &&
           ((*(ulong *)((long)&asi_local[0x38].list._dtor + 2) >> 0x1c & 1) != 0)) &&
          ((asi_local[0x66].filename == (char *)0x0 || (0 < *(int *)(asi_local[0x66].filename + 8)))
          )) {
    Curl_infof((Curl_easy *)asi_local,"Excessive alt-svc header, ignoring.");
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  size_t len;
  char namebuf[MAX_ALTSVC_HOSTLEN] = "";
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            len = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[len] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            len += 2;
            p = &p[len-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            len = p - hostp;
          }
          if(!len || (len >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            memcpy(namebuf, hostp, len);
            namebuf[len] = 0;
            dsthost = namebuf;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}